

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

void pac_decay_to_limit(tsdn_t *tsdn,pac_t *pac,decay_t *decay,pac_decay_stats_t *decay_stats,
                       ecache_t *ecache,_Bool fully_decay,size_t npages_limit,
                       size_t npages_decay_max)

{
  atomic_zu_t *paVar1;
  _Bool _Var2;
  ehooks_t *peVar3;
  edata_t *peVar4;
  edata_t *peVar5;
  edata_t *edata;
  long lVar6;
  ulong uVar7;
  long lVar8;
  edata_t *edata_00;
  bool bVar9;
  long local_50;
  
  if ((npages_decay_max == 0) || (decay->purging != false)) {
    return;
  }
  decay->purging = true;
  (decay->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
  peVar3 = pac_ehooks_get(pac);
  uVar7 = 0;
  edata_00 = (edata_t *)0x0;
  do {
    if (npages_decay_max <= uVar7) {
LAB_01e946d4:
      peVar3 = pac_ehooks_get(pac);
      bVar9 = true;
      if (!fully_decay) {
        bVar9 = (pac->decay_muzzy).time_ms.repr == 0;
      }
      lVar8 = 0;
      local_50 = 0;
      lVar6 = 0;
      while (edata_00 != (edata_t *)0x0) {
        peVar4 = (edata_00->field_6).ql_link_inactive.qre_next;
        if (peVar4 == edata_00) {
          peVar4 = (edata_t *)0x0;
        }
        else {
          (((edata_00->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
               (peVar4->field_6).ql_link_inactive.qre_prev;
          peVar5 = (edata_00->field_6).ql_link_inactive.qre_prev;
          (((edata_00->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev =
               peVar5;
          (edata_00->field_6).ql_link_inactive.qre_prev =
               (peVar5->field_6).ql_link_inactive.qre_next;
          peVar5 = (edata_00->field_6).ql_link_inactive.qre_next;
          (((peVar5->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
               peVar5;
          (((edata_00->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
               edata_00;
        }
        uVar7 = (edata_00->field_2).e_size_esn >> 0xc;
        lVar8 = lVar8 + uVar7;
        if ((ecache->state != extent_state_dirty || bVar9) ||
           (_Var2 = duckdb_je_extent_purge_lazy_wrapper
                              (tsdn,peVar3,edata_00,0,
                               (edata_00->field_2).e_size_esn & 0xfffffffffffff000), _Var2)) {
          duckdb_je_extent_dalloc_wrapper(tsdn,pac,peVar3,edata_00);
          local_50 = local_50 + uVar7;
          lVar6 = lVar6 + 1;
          edata_00 = peVar4;
        }
        else {
          duckdb_je_ecache_dalloc(tsdn,pac,peVar3,&pac->ecache_muzzy,edata_00);
          lVar6 = lVar6 + 1;
          edata_00 = peVar4;
        }
      }
      LOCK();
      (decay_stats->npurge).val.repr = (decay_stats->npurge).val.repr + 1;
      UNLOCK();
      LOCK();
      (decay_stats->nmadvise).val.repr = (decay_stats->nmadvise).val.repr + lVar6;
      UNLOCK();
      LOCK();
      (decay_stats->purged).val.repr = (decay_stats->purged).val.repr + lVar8;
      UNLOCK();
      LOCK();
      paVar1 = &pac->stats->pac_mapped;
      paVar1->repr = paVar1->repr + local_50 * -0x1000;
      UNLOCK();
LAB_01e94824:
      malloc_mutex_lock(tsdn,&decay->mtx);
      decay->purging = false;
      return;
    }
    peVar4 = duckdb_je_ecache_evict(tsdn,pac,peVar3,ecache,npages_limit);
    if (peVar4 == (edata_t *)0x0) {
      if (uVar7 == 0) goto LAB_01e94824;
      goto LAB_01e946d4;
    }
    (peVar4->field_6).ql_link_inactive.qre_next = peVar4;
    (peVar4->field_6).ql_link_inactive.qre_prev = peVar4;
    peVar5 = peVar4;
    if (edata_00 != (edata_t *)0x0) {
      (peVar4->field_6).ql_link_inactive.qre_next = (edata_00->field_6).ql_link_inactive.qre_prev;
      (edata_00->field_6).ql_link_inactive.qre_prev = peVar4;
      (peVar4->field_6).ql_link_inactive.qre_prev =
           (((peVar4->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
      (((edata_00->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
           edata_00;
      (((peVar4->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar4;
      peVar5 = (peVar4->field_6).ql_link_inactive.qre_next;
    }
    uVar7 = uVar7 + ((peVar4->field_2).e_size_esn >> 0xc);
    edata_00 = peVar5;
  } while( true );
}

Assistant:

static void
pac_decay_to_limit(tsdn_t *tsdn, pac_t *pac, decay_t *decay,
    pac_decay_stats_t *decay_stats, ecache_t *ecache, bool fully_decay,
    size_t npages_limit, size_t npages_decay_max) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 1);

	if (decay->purging || npages_decay_max == 0) {
		return;
	}
	decay->purging = true;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	edata_list_inactive_t decay_extents;
	edata_list_inactive_init(&decay_extents);
	size_t npurge = pac_stash_decayed(tsdn, pac, ecache, npages_limit,
	    npages_decay_max, &decay_extents);
	if (npurge != 0) {
		size_t npurged = pac_decay_stashed(tsdn, pac, decay,
		    decay_stats, ecache, fully_decay, &decay_extents);
		assert(npurged == npurge);
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	decay->purging = false;
}